

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void __thiscall
Test::Assertion::Assertion
          (Assertion *this,char *fileName,uint32_t lineNum,string *errorMsg,string *userMsg)

{
  char *__s;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  string *local_30;
  string *userMsg_local;
  string *errorMsg_local;
  char *pcStack_18;
  uint32_t lineNum_local;
  char *fileName_local;
  Assertion *this_local;
  
  local_30 = userMsg;
  userMsg_local = errorMsg;
  errorMsg_local._4_4_ = lineNum;
  pcStack_18 = fileName;
  fileName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  __s = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->file,__s,local_45);
  std::allocator<char>::~allocator(local_45);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->method,"",&local_46);
  std::allocator<char>::~allocator(&local_46);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->args,"",&local_47);
  std::allocator<char>::~allocator(&local_47);
  std::__cxx11::string::string((string *)&this->errorMessage,userMsg_local);
  std::__cxx11::string::string((string *)&this->userMessage,local_30);
  this->lineNumber = errorMsg_local._4_4_;
  return;
}

Assistant:

Assertion::Assertion(
    const char *fileName, uint32_t lineNum, const std::string &errorMsg, const std::string &userMsg)
    : suite(""), file(fileName), method(""), args(""), errorMessage(errorMsg), userMessage(userMsg),
      lineNumber(lineNum) {}